

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O1

void __thiscall
duckdb::WindowQuantileState<duckdb::interval_t>::SkipListUpdater::Left
          (SkipListUpdater *this,idx_t begin,idx_t end)

{
  unsigned_long *puVar1;
  CURSOR_TYPE *pCVar2;
  SkipListType *__filename;
  CursorType *pCVar3;
  reference pvVar4;
  ulong uVar5;
  
  if (begin < end) {
    do {
      puVar1 = (this->included->fmask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[begin >> 6] >> (begin & 0x3f) & 1) != 0)) {
        pCVar2 = this->included->dmask;
        if (((ColumnDataScanState *)(pCVar2->scan).next_row_index <= begin) ||
           (begin < (ColumnDataScanState *)(pCVar2->scan).current_row_index)) {
          duckdb::ColumnDataCollection::Seek
                    ((ulong)pCVar2->inputs,(ColumnDataScanState *)begin,(DataChunk *)&pCVar2->scan);
          pvVar4 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
          pCVar2->data = *(interval_t **)(pvVar4 + 0x20);
          pvVar4 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
          FlatVector::VerifyFlatVector(pvVar4);
          pCVar2->validity = (ValidityMask *)(pvVar4 + 0x28);
        }
        puVar1 = (pCVar2->validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar1 == (unsigned_long *)0x0) ||
           (uVar5 = begin - (pCVar2->scan).current_row_index,
           (puVar1[uVar5 >> 6 & 0x3ffffff] >> (uVar5 & 0x3f) & 1) != 0)) {
          __filename = this->skip;
          pCVar3 = this->data;
          if (((ColumnDataScanState *)(pCVar3->scan).next_row_index <= begin) ||
             (begin < (ColumnDataScanState *)(pCVar3->scan).current_row_index)) {
            duckdb::ColumnDataCollection::Seek
                      ((ulong)pCVar3->inputs,(ColumnDataScanState *)begin,(DataChunk *)&pCVar3->scan
                      );
            pvVar4 = vector<duckdb::Vector,_true>::operator[]
                               ((vector<duckdb::Vector,_true> *)&pCVar3->page,0);
            pCVar3->data = *(interval_t **)(pvVar4 + 0x20);
            pvVar4 = vector<duckdb::Vector,_true>::operator[]
                               ((vector<duckdb::Vector,_true> *)&pCVar3->page,0);
            FlatVector::VerifyFlatVector(pvVar4);
            pCVar3->validity = (ValidityMask *)(pvVar4 + 0x28);
          }
          duckdb_skiplistlib::skip_list::
          HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
          ::remove((HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                    *)&stack0xffffffffffffffb8,(char *)__filename);
        }
      }
      begin = (long)&(((ColumnDataScanState *)begin)->current_chunk_state).handles._M_h._M_buckets +
              1;
    } while (end != begin);
  }
  return;
}

Assistant:

inline void Left(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					skip.remove(SkipType(begin, data[begin]));
				}
			}
		}